

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.cpp
# Opt level: O0

void lume::FillGrobToIndexMap(GrobHashMap<GrobIndex> *indexMapInOut,Mesh *mesh,GrobSet grobSet)

{
  bool bVar1;
  index_t iVar2;
  grob_t grobType_00;
  GrobArray *this;
  reference pGVar3;
  iterator iVar4;
  GrobIndex local_d8;
  pair<lume::Grob,_lume::GrobIndex> local_d0;
  undefined1 local_b0 [8];
  Grob grob;
  iterator __end2;
  iterator __begin2;
  GrobArray *__range2;
  index_t counter;
  grob_t grobType;
  iterator __end1;
  iterator __begin1;
  GrobSet *__range1;
  Mesh *mesh_local;
  GrobHashMap<GrobIndex> *indexMapInOut_local;
  GrobSet grobSet_local;
  
  indexMapInOut_local._4_4_ = grobSet.m_offset;
  iVar2 = Mesh::num(mesh,(GrobSet *)((long)&indexMapInOut_local + 4));
  std::
  unordered_map<lume::Grob,_lume::GrobIndex,_std::hash<lume::Grob>,_std::equal_to<lume::Grob>,_std::allocator<std::pair<const_lume::Grob,_lume::GrobIndex>_>_>
  ::reserve(indexMapInOut,(ulong)iVar2);
  iVar4 = GrobSet::begin((GrobSet *)((long)&indexMapInOut_local + 4));
  __end1.set._0_4_ = iVar4.index;
  iVar4 = GrobSet::end((GrobSet *)((long)&indexMapInOut_local + 4));
  __end1._0_8_ = iVar4.set;
  counter = iVar4.index;
  while (bVar1 = GrobSet::iterator::operator!=((iterator *)&__end1.set,(iterator *)&counter), bVar1)
  {
    grobType_00 = GrobSet::iterator::operator*((iterator *)&__end1.set);
    bVar1 = Mesh::has(mesh,grobType_00);
    if (bVar1) {
      __range2._0_4_ = 0;
      this = Mesh::grobs(mesh,grobType_00);
      GrobArray::begin((iterator *)&__end2.m_numCorners,this);
      GrobArray::end((iterator *)&grob.m_desc,this);
      while (bVar1 = GrobIterator::operator!=
                               ((GrobIterator *)&__end2.m_numCorners,(GrobIterator *)&grob.m_desc),
            bVar1) {
        pGVar3 = GrobIterator::operator*((GrobIterator *)&__end2.m_numCorners);
        Grob::Grob((Grob *)local_b0,pGVar3);
        GrobIndex::GrobIndex(&local_d8,grobType_00,(index_t)__range2);
        std::make_pair<lume::Grob&,lume::GrobIndex>(&local_d0,(Grob *)local_b0,&local_d8);
        std::
        unordered_map<lume::Grob,lume::GrobIndex,std::hash<lume::Grob>,std::equal_to<lume::Grob>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>>
        ::insert<std::pair<lume::Grob,lume::GrobIndex>>
                  ((unordered_map<lume::Grob,lume::GrobIndex,std::hash<lume::Grob>,std::equal_to<lume::Grob>,std::allocator<std::pair<lume::Grob_const,lume::GrobIndex>>>
                    *)indexMapInOut,&local_d0);
        GrobIterator::operator++((GrobIterator *)&__end2.m_numCorners);
        __range2._0_4_ = (index_t)__range2 + 1;
      }
    }
    GrobSet::iterator::operator++((iterator *)&__end1.set);
  }
  return;
}

Assistant:

void FillGrobToIndexMap (GrobHashMap <GrobIndex>& indexMapInOut,
                       const Mesh& mesh,
                       const GrobSet grobSet)
{
	indexMapInOut.reserve (mesh.num (grobSet));
	
	for (auto grobType : grobSet) {
		if (!mesh.has (grobType))
			continue;
		
		index_t counter = 0;

		for(auto grob : mesh.grobs (grobType)) {
			indexMapInOut.insert (make_pair (grob, GrobIndex (grobType, counter++)));
		}
	}
}